

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unrolling.cpp
# Opt level: O0

void optimization::loop_unrolling::expand_loop(MirFunction *func,BasicBlk *blk,loop_info *info)

{
  initializer_list<mir::inst::VarId> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ostream *poVar4;
  void *this;
  pointer ppVar5;
  VarId *__args;
  VarId *__args_2;
  pointer pIVar6;
  iterator this_00;
  mapped_type *pmVar7;
  VarId *pVVar8;
  Rewriter *in_RDX;
  long in_RSI;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>,_bool> pVar9;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range2_1;
  PhiInst *phiInst;
  Inst *i;
  value_type *inst;
  VarId cond;
  VarId new_phi;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  insts;
  VarId new_change_var;
  int times;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_1;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range2;
  mapped_type *extra_loop_blk;
  mapped_type *extra_loop_start_blk;
  int extra_loop;
  int extra_loop_start;
  iterator end_iter;
  Rewriter rwt;
  mapped_type *loop_start;
  undefined4 in_stack_fffffffffffff068;
  uint32_t in_stack_fffffffffffff06c;
  pair<const_int,_mir::inst::BasicBlk> *in_stack_fffffffffffff070;
  JumpInstruction *pJVar10;
  undefined4 in_stack_fffffffffffff078;
  undefined4 in_stack_fffffffffffff07c;
  LabelId LVar11;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  in_stack_fffffffffffff080;
  const_iterator in_stack_fffffffffffff088;
  JumpInstruction *in_stack_fffffffffffff090;
  Function *in_stack_fffffffffffff098;
  BasicBlk *in_stack_fffffffffffff0a0;
  MirFunction *in_stack_fffffffffffff0a8;
  Rewriter *in_stack_fffffffffffff0b0;
  undefined4 in_stack_fffffffffffff0b8;
  undefined4 in_stack_fffffffffffff0bc;
  OpInst *in_stack_fffffffffffff0c0;
  undefined4 in_stack_fffffffffffff0c8;
  LabelId in_stack_fffffffffffff0cc;
  BasicBlk *in_stack_fffffffffffff0d0;
  VarId *in_stack_fffffffffffff0d8;
  Timestamp *in_stack_fffffffffffff0f8;
  VarId *in_stack_fffffffffffff100;
  loop_info *in_stack_fffffffffffff108;
  Op *__args_3;
  Severity *in_stack_fffffffffffff168;
  ostream *in_stack_fffffffffffff170;
  BasicBlk *in_stack_fffffffffffff188;
  BasicBlk *blk_00;
  loop_info *in_stack_fffffffffffff190;
  loop_info *this_01;
  Rewriter *this_02;
  undefined1 local_c90 [80];
  reference local_c40;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_c38;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_c30;
  undefined1 *local_c28;
  VarId *local_c20;
  VarId *local_c18;
  VarId *local_c10;
  VarId *local_c08;
  undefined8 local_bf8;
  type local_bf0;
  reference local_be8;
  JumpInstruction local_bc8;
  JumpInstruction local_b78;
  Op local_b30 [10];
  undefined1 local_b08 [32];
  undefined1 *local_ae8;
  undefined8 local_ae0;
  VarId local_ab8 [2];
  undefined1 local_a90 [44];
  int local_a64;
  JumpInstruction local_a48;
  reference local_a08;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_a00;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_9f8;
  long local_9f0;
  undefined1 local_9e2 [18];
  undefined8 local_9d0;
  LabelId local_990;
  LabelId local_98c;
  undefined1 *local_988;
  undefined8 local_980;
  LabelId local_940;
  undefined4 local_93c;
  LabelId *local_938;
  undefined8 local_930;
  undefined1 local_928 [56];
  pair<mir::inst::Op,_int> local_8f0;
  Displayable local_8e8;
  undefined1 local_8e0;
  _Base_ptr local_7b0;
  undefined1 local_7a8;
  int local_678;
  int local_674;
  _Base_ptr local_670;
  _Base_ptr local_668;
  _Base_ptr local_660;
  allocator<char> local_4d9;
  string local_4d8 [39];
  allocator<char> local_4b1;
  string local_4b0 [120];
  time_point_sys_clock local_438;
  Timestamp local_430 [3];
  undefined1 local_3e1;
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [120];
  time_point_sys_clock local_278;
  Timestamp local_270 [3];
  undefined1 local_222;
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [120];
  time_point_sys_clock local_180;
  Timestamp local_178 [3];
  undefined1 local_12a;
  allocator<char> local_129;
  string local_128 [39];
  undefined1 local_101 [121];
  time_point_sys_clock local_88;
  Timestamp local_80 [3];
  undefined1 local_21;
  mapped_type *local_20;
  long local_10;
  
  this_02 = in_RDX;
  local_10 = in_RSI;
  local_20 = std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                   *)in_stack_fffffffffffff090,(key_type *)in_stack_fffffffffffff088._M_current);
  local_21 = 0;
  AixLog::operator<<(in_stack_fffffffffffff170,in_stack_fffffffffffff168);
  AixLog::Tag::Tag((Tag *)0x1ee4c0);
  AixLog::operator<<((ostream *)in_stack_fffffffffffff0a0,(Tag *)in_stack_fffffffffffff098);
  local_88.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(local_80,&local_88);
  poVar3 = AixLog::operator<<((ostream *)in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
  pVVar8 = (VarId *)local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0b0,(char *)in_stack_fffffffffffff0a8,
             (allocator<char> *)in_stack_fffffffffffff0a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0b0,(char *)in_stack_fffffffffffff0a8,
             (allocator<char> *)in_stack_fffffffffffff0a0);
  AixLog::Function::Function
            ((Function *)in_stack_fffffffffffff080._M_current,
             (string *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
             (string *)in_stack_fffffffffffff070,
             CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  poVar4 = AixLog::operator<<((ostream *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff098);
  poVar4 = std::operator<<(poVar4,"unroll loop starts at  ");
  this = (void *)std::ostream::operator<<(poVar4,*(LabelId *)((long)&in_RDX->func + 4));
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  AixLog::Function::~Function((Function *)in_stack_fffffffffffff070);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)(local_101 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_101);
  AixLog::Timestamp::~Timestamp(local_80);
  AixLog::Tag::~Tag((Tag *)0x1ee67c);
  local_12a = 0;
  AixLog::operator<<(in_stack_fffffffffffff170,in_stack_fffffffffffff168);
  AixLog::Tag::Tag((Tag *)0x1ee6b5);
  AixLog::operator<<((ostream *)in_stack_fffffffffffff0a0,(Tag *)in_stack_fffffffffffff098);
  local_180.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(local_178,&local_180);
  AixLog::operator<<((ostream *)in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0b0,(char *)in_stack_fffffffffffff0a8,
             (allocator<char> *)in_stack_fffffffffffff0a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0b0,(char *)in_stack_fffffffffffff0a8,
             (allocator<char> *)in_stack_fffffffffffff0a0);
  AixLog::Function::Function
            ((Function *)in_stack_fffffffffffff080._M_current,
             (string *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
             (string *)in_stack_fffffffffffff070,
             CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  poVar4 = AixLog::operator<<((ostream *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff098);
  std::operator<<(poVar4,"init_val: ");
  poVar4 = prelude::operator<<((ostream *)in_stack_fffffffffffff070,
                               (Displayable *)
                               CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  AixLog::Function::~Function((Function *)in_stack_fffffffffffff070);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  AixLog::Timestamp::~Timestamp(local_178);
  AixLog::Tag::~Tag((Tag *)0x1ee872);
  local_222 = 0;
  AixLog::operator<<(in_stack_fffffffffffff170,in_stack_fffffffffffff168);
  AixLog::Tag::Tag((Tag *)0x1ee8ab);
  AixLog::operator<<((ostream *)in_stack_fffffffffffff0a0,(Tag *)in_stack_fffffffffffff098);
  local_278.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(local_270,&local_278);
  AixLog::operator<<((ostream *)in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0b0,(char *)in_stack_fffffffffffff0a8,
             (allocator<char> *)in_stack_fffffffffffff0a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0b0,(char *)in_stack_fffffffffffff0a8,
             (allocator<char> *)in_stack_fffffffffffff0a0);
  AixLog::Function::Function
            ((Function *)in_stack_fffffffffffff080._M_current,
             (string *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
             (string *)in_stack_fffffffffffff070,
             CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  poVar4 = AixLog::operator<<((ostream *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff098);
  std::operator<<(poVar4,"change : ");
  mir::inst::VarId::VarId
            ((VarId *)in_stack_fffffffffffff070,
             (VarId *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  mir::inst::VarId::VarId
            ((VarId *)in_stack_fffffffffffff070,
             (VarId *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  mir::inst::Value::Value
            ((Value *)in_stack_fffffffffffff070,
             (VarId *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  mir::inst::Value::Value((Value *)in_stack_fffffffffffff070,in_stack_fffffffffffff06c);
  mir::inst::OpInst::OpInst
            (in_stack_fffffffffffff0c0,
             (VarId *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
             (Value *)in_stack_fffffffffffff0b0,(Value *)in_stack_fffffffffffff0a8,
             (Op)((ulong)in_stack_fffffffffffff0a0 >> 0x20));
  poVar4 = prelude::operator<<((ostream *)in_stack_fffffffffffff070,
                               (Displayable *)
                               CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  mir::inst::OpInst::~OpInst((OpInst *)0x1eeab8);
  AixLog::Function::~Function((Function *)in_stack_fffffffffffff070);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  AixLog::Timestamp::~Timestamp(local_270);
  AixLog::Tag::~Tag((Tag *)0x1eeb13);
  local_3e1 = 0;
  AixLog::operator<<(in_stack_fffffffffffff170,in_stack_fffffffffffff168);
  AixLog::Tag::Tag((Tag *)0x1eeb4c);
  AixLog::operator<<((ostream *)in_stack_fffffffffffff0a0,(Tag *)in_stack_fffffffffffff098);
  local_438.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(local_430,&local_438);
  AixLog::operator<<((ostream *)in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0b0,(char *)in_stack_fffffffffffff0a8,
             (allocator<char> *)in_stack_fffffffffffff0a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0b0,(char *)in_stack_fffffffffffff0a8,
             (allocator<char> *)in_stack_fffffffffffff0a0);
  AixLog::Function::Function
            ((Function *)in_stack_fffffffffffff080._M_current,
             (string *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
             (string *)in_stack_fffffffffffff070,
             CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  poVar4 = AixLog::operator<<((ostream *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff098);
  std::operator<<(poVar4,"continue when: ");
  mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff070,in_stack_fffffffffffff06c);
  mir::inst::VarId::VarId
            ((VarId *)in_stack_fffffffffffff070,
             (VarId *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  mir::inst::Value::Value
            ((Value *)in_stack_fffffffffffff070,
             (VarId *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  mir::inst::VarId::VarId
            ((VarId *)in_stack_fffffffffffff070,
             (VarId *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  mir::inst::Value::Value
            ((Value *)in_stack_fffffffffffff070,
             (VarId *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  mir::inst::OpInst::OpInst
            (in_stack_fffffffffffff0c0,
             (VarId *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
             (Value *)in_stack_fffffffffffff0b0,(Value *)in_stack_fffffffffffff0a8,
             (Op)((ulong)in_stack_fffffffffffff0a0 >> 0x20));
  poVar4 = prelude::operator<<((ostream *)in_stack_fffffffffffff070,
                               (Displayable *)
                               CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  mir::inst::OpInst::~OpInst((OpInst *)0x1eed6b);
  AixLog::Function::~Function((Function *)in_stack_fffffffffffff070);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  AixLog::Timestamp::~Timestamp(local_430);
  AixLog::Tag::~Tag((Tag *)0x1eedc6);
  std::pair<mir::inst::VarId,_mir::inst::VarId>::pair<mir::inst::VarId_&,_mir::inst::VarId_&,_true>
            ((pair<mir::inst::VarId,_mir::inst::VarId> *)in_stack_fffffffffffff080._M_current,
             (VarId *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
             (VarId *)in_stack_fffffffffffff070);
  mir::inst::VarId::VarId
            ((VarId *)in_stack_fffffffffffff070,
             (VarId *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  Rewriter::Rewriter(in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
                     (pair<mir::inst::VarId,_mir::inst::VarId> *)in_stack_fffffffffffff098,
                     (VarId *)in_stack_fffffffffffff090);
  std::
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
        *)in_stack_fffffffffffff090,(key_type *)in_stack_fffffffffffff088._M_current);
  loop_info::rewrite_jump_cond(in_stack_fffffffffffff190,in_stack_fffffffffffff188);
  local_660 = (_Base_ptr)
              std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                     *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  local_668 = (_Base_ptr)
              std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator--
                        ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                         CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                         (int)((ulong)in_stack_fffffffffffff070 >> 0x20));
  local_670 = (_Base_ptr)
              std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator--
                        ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                         CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                         (int)((ulong)in_stack_fffffffffffff070 >> 0x20));
  ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1eef02);
  local_674 = ppVar5->first + 1;
  ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1eef1a);
  local_678 = ppVar5->first + 2;
  mir::inst::BasicBlk::BasicBlk(in_stack_fffffffffffff0d0,in_stack_fffffffffffff0cc);
  std::pair<const_int,_mir::inst::BasicBlk>::pair<int_&,_mir::inst::BasicBlk,_true>
            (in_stack_fffffffffffff070,
             (int *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
             (BasicBlk *)0x1eef6d);
  pVar9 = std::
          map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
          ::insert((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    *)in_stack_fffffffffffff080._M_current,
                   (value_type *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
  local_7b0 = (_Base_ptr)pVar9.first._M_node;
  local_7a8 = pVar9.second;
  std::pair<const_int,_mir::inst::BasicBlk>::~pair((pair<const_int,_mir::inst::BasicBlk> *)0x1eefc0)
  ;
  mir::inst::BasicBlk::~BasicBlk((BasicBlk *)in_stack_fffffffffffff070);
  mir::inst::BasicBlk::BasicBlk(in_stack_fffffffffffff0d0,in_stack_fffffffffffff0cc);
  std::pair<const_int,_mir::inst::BasicBlk>::pair<int_&,_mir::inst::BasicBlk,_true>
            (in_stack_fffffffffffff070,
             (int *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
             (BasicBlk *)0x1ef014);
  pVar9 = std::
          map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
          ::insert((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    *)in_stack_fffffffffffff080._M_current,
                   (value_type *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
  local_8e8._vptr_Displayable = (_func_int **)pVar9.first._M_node;
  local_8e0 = pVar9.second;
  std::pair<const_int,_mir::inst::BasicBlk>::~pair((pair<const_int,_mir::inst::BasicBlk> *)0x1ef067)
  ;
  mir::inst::BasicBlk::~BasicBlk((BasicBlk *)in_stack_fffffffffffff070);
  local_8f0 = (pair<mir::inst::Op,_int>)
              std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    *)in_stack_fffffffffffff090,(key_type *)in_stack_fffffffffffff088._M_current);
  local_928._48_8_ =
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             *)in_stack_fffffffffffff090,(key_type *)in_stack_fffffffffffff088._M_current);
  local_940 = local_20->id;
  local_93c = *(undefined4 *)(local_10 + 8);
  local_938 = &local_940;
  local_930 = 2;
  std::allocator<int>::allocator((allocator<int> *)0x1ef12f);
  __l_00._M_array._4_4_ = in_stack_fffffffffffff0cc;
  __l_00._M_array._0_4_ = in_stack_fffffffffffff0c8;
  __l_00._M_len = (size_type)in_stack_fffffffffffff0d0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff0c0,__l_00,
             (less<int> *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
             (allocator_type *)in_stack_fffffffffffff0b0);
  this_01 = (loop_info *)local_928;
  std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff070,
             (set<int,_std::less<int>,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1ef18c);
  std::allocator<int>::~allocator((allocator<int> *)0x1ef199);
  local_990 = *(LabelId *)((long)local_8f0 + 8);
  local_98c = *(LabelId *)(local_928._48_8_ + 8);
  local_988 = local_9e2 + 0x52;
  local_980 = 2;
  std::allocator<int>::allocator((allocator<int> *)0x1ef1ee);
  __l_01._M_array._4_4_ = in_stack_fffffffffffff0cc;
  __l_01._M_array._0_4_ = in_stack_fffffffffffff0c8;
  __l_01._M_len = (size_type)in_stack_fffffffffffff0d0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff0c0,__l_01,
             (less<int> *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
             (allocator_type *)in_stack_fffffffffffff0b0);
  std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff070,
             (set<int,_std::less<int>,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1ef24b);
  std::allocator<int>::~allocator((allocator<int> *)0x1ef258);
  local_9e2._2_4_ = *(LabelId *)((long)local_8f0 + 8);
  local_9e2._6_4_ = *(LabelId *)(local_928._48_8_ + 8);
  local_9e2._10_8_ = local_9e2 + 2;
  local_9d0 = 2;
  blk_00 = (BasicBlk *)local_9e2;
  std::allocator<int>::allocator((allocator<int> *)0x1ef2ad);
  __l_02._M_array._4_4_ = in_stack_fffffffffffff0cc;
  __l_02._M_array._0_4_ = in_stack_fffffffffffff0c8;
  __l_02._M_len = (size_type)in_stack_fffffffffffff0d0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff0c0,__l_02,
             (less<int> *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
             (allocator_type *)in_stack_fffffffffffff0b0);
  std::
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
        *)in_stack_fffffffffffff090,(key_type *)in_stack_fffffffffffff088._M_current);
  std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff070,
             (set<int,_std::less<int>,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1ef32c);
  std::allocator<int>::~allocator((allocator<int> *)0x1ef339);
  local_9f0 = local_10 + 0x40;
  local_9f8._M_current =
       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
       std::
       vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
       ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  local_a00 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                        *)in_stack_fffffffffffff070,
                       (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
    iVar2 = (int)((ulong)poVar3 >> 0x20);
    if (!bVar1) break;
    local_a08 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                ::operator*(&local_9f8);
    pIVar6 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                       ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                        0x1ef3cb);
    (*(pIVar6->super_Displayable)._vptr_Displayable[6])();
    std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
    unique_ptr<std::default_delete<mir::inst::Inst>,void>
              ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
               in_stack_fffffffffffff070,
               (pointer)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
    std::
    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 *)in_stack_fffffffffffff070,
                (value_type *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
    std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
              ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
               in_stack_fffffffffffff080._M_current);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
    ::operator++(&local_9f8);
  }
  std::optional<mir::inst::VarId>::optional
            ((optional<mir::inst::VarId> *)in_stack_fffffffffffff070,
             (optional<mir::inst::VarId> *)
             CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  mir::inst::JumpInstruction::JumpInstruction
            (in_stack_fffffffffffff090,
             (JumpInstructionKind)((ulong)in_stack_fffffffffffff088._M_current >> 0x20),
             (int)in_stack_fffffffffffff088._M_current,
             (int)((ulong)in_stack_fffffffffffff080._M_current >> 0x20),
             (optional<mir::inst::VarId> *)
             CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
             (JumpKind)((ulong)in_stack_fffffffffffff070 >> 0x20));
  mir::inst::JumpInstruction::operator=
            ((JumpInstruction *)in_stack_fffffffffffff070,
             (JumpInstruction *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  mir::inst::JumpInstruction::~JumpInstruction(&local_a48);
  loop_info::rewrite_jump_cond(this_01,blk_00);
  local_a64 = loop_info::get_times((loop_info *)in_RDX);
  mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff070);
  Rewriter::get_insts(this_02,iVar2,pVVar8);
  mir::inst::VarId::VarId
            ((VarId *)in_stack_fffffffffffff070,
             (VarId *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  loop_info::copy_var(in_stack_fffffffffffff108,in_stack_fffffffffffff100);
  __args = (VarId *)((long)local_8f0 + 0x40);
  mir::inst::VarId::VarId
            ((VarId *)in_stack_fffffffffffff070,
             (VarId *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  mir::inst::VarId::VarId
            ((VarId *)in_stack_fffffffffffff070,
             (VarId *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  local_ae0 = 2;
  local_ae8 = local_b08;
  std::allocator<mir::inst::VarId>::allocator((allocator<mir::inst::VarId> *)0x1efb4f);
  __l._M_len = (size_type)in_stack_fffffffffffff0b0;
  __l._M_array = (iterator)in_stack_fffffffffffff0a8;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
             in_stack_fffffffffffff0a0,__l,(allocator_type *)in_stack_fffffffffffff098);
  std::
  make_unique<mir::inst::PhiInst,mir::inst::VarId&,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>
            (in_stack_fffffffffffff0d8,
             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
             in_stack_fffffffffffff0d0);
  pVVar8 = local_ab8;
  std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
  unique_ptr<mir::inst::PhiInst,std::default_delete<mir::inst::PhiInst>,void>
            ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
             in_stack_fffffffffffff080._M_current,
             (unique_ptr<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_> *)
             CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               *)in_stack_fffffffffffff070,
              (value_type *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
            ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
             in_stack_fffffffffffff080._M_current);
  std::unique_ptr<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_>::~unique_ptr
            ((unique_ptr<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_> *)
             in_stack_fffffffffffff070);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
             in_stack_fffffffffffff080._M_current);
  std::allocator<mir::inst::VarId>::~allocator((allocator<mir::inst::VarId> *)0x1efbfd);
  __args_2 = std::optional<mir::inst::VarId>::value
                       ((optional<mir::inst::VarId> *)in_stack_fffffffffffff070);
  __args_3 = local_b30;
  mir::inst::VarId::VarId
            ((VarId *)in_stack_fffffffffffff070,
             (VarId *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  loop_info::copy_var(in_stack_fffffffffffff108,in_stack_fffffffffffff100);
  std::
  make_unique<mir::inst::OpInst,mir::inst::VarId&,mir::inst::VarId&,mir::inst::VarId&,mir::inst::Op&>
            (__args,pVVar8,__args_2,__args_3);
  std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
  unique_ptr<mir::inst::OpInst,std::default_delete<mir::inst::OpInst>,void>
            ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
             in_stack_fffffffffffff080._M_current,
             (unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_> *)
             CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               *)in_stack_fffffffffffff070,
              (value_type *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
            ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
             in_stack_fffffffffffff080._M_current);
  std::unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>::~unique_ptr
            ((unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_> *)
             in_stack_fffffffffffff070);
  std::optional<mir::inst::VarId>::optional<mir::inst::VarId_&,_true>
            ((optional<mir::inst::VarId> *)in_stack_fffffffffffff070,
             (VarId *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  mir::inst::JumpInstruction::JumpInstruction
            (in_stack_fffffffffffff090,
             (JumpInstructionKind)((ulong)in_stack_fffffffffffff088._M_current >> 0x20),
             (int)in_stack_fffffffffffff088._M_current,
             (int)((ulong)in_stack_fffffffffffff080._M_current >> 0x20),
             (optional<mir::inst::VarId> *)
             CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
             (JumpKind)((ulong)in_stack_fffffffffffff070 >> 0x20));
  pJVar10 = &local_b78;
  mir::inst::JumpInstruction::operator=
            ((JumpInstruction *)in_stack_fffffffffffff070,
             (JumpInstruction *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  mir::inst::JumpInstruction::~JumpInstruction(pJVar10);
  std::optional<mir::inst::VarId>::value((optional<mir::inst::VarId> *)in_stack_fffffffffffff070);
  std::optional<mir::inst::VarId>::optional<mir::inst::VarId_&,_true>
            ((optional<mir::inst::VarId> *)in_stack_fffffffffffff070,
             (VarId *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  mir::inst::JumpInstruction::JumpInstruction
            (in_stack_fffffffffffff090,
             (JumpInstructionKind)((ulong)in_stack_fffffffffffff088._M_current >> 0x20),
             (int)in_stack_fffffffffffff088._M_current,
             (int)((ulong)in_stack_fffffffffffff080._M_current >> 0x20),
             (optional<mir::inst::VarId> *)
             CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
             (JumpKind)((ulong)in_stack_fffffffffffff070 >> 0x20));
  pJVar10 = &local_bc8;
  mir::inst::JumpInstruction::operator=
            ((JumpInstruction *)in_stack_fffffffffffff070,
             (JumpInstruction *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  mir::inst::JumpInstruction::~JumpInstruction(pJVar10);
  local_be8 = std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::front((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffff070);
  local_bf0 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator*
                        ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         in_stack_fffffffffffff070);
  pIVar6 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                     ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x1efe61
                     );
  iVar2 = (*(pIVar6->super_Displayable)._vptr_Displayable[1])();
  if (iVar2 == 7) {
    if (local_bf0 == (type)0x0) {
      local_bf8 = 0;
    }
    else {
      local_bf8 = __dynamic_cast(local_bf0,&mir::inst::Inst::typeinfo,&mir::inst::PhiInst::typeinfo,
                                 0);
    }
    local_c10 = (VarId *)std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::begin
                                   ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                    CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
    local_c18 = (VarId *)std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end
                                   ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                    CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
    local_c08 = (VarId *)std::
                         find<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,mir::inst::VarId>
                                   (in_stack_fffffffffffff088._M_current,in_stack_fffffffffffff080,
                                    (VarId *)CONCAT44(in_stack_fffffffffffff07c,
                                                      in_stack_fffffffffffff078));
    __gnu_cxx::
    __normal_iterator<mir::inst::VarId_const*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>
    ::__normal_iterator<mir::inst::VarId*>
              ((__normal_iterator<const_mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                *)in_stack_fffffffffffff070,
               (__normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
    this_00 = std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::erase
                        (in_stack_fffffffffffff080._M_current,in_stack_fffffffffffff088);
    local_c20 = this_00._M_current;
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               in_stack_fffffffffffff080._M_current,
               (value_type *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
    std::
    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ::clear((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)0x1f0084);
    local_c28 = local_a90;
    local_c30._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
    local_c38 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                std::
                vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          *)in_stack_fffffffffffff070,
                         (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
      if (!bVar1) break;
      local_c40 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                  ::operator*(&local_c30);
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   *)in_stack_fffffffffffff070,
                  (value_type *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator++(&local_c30);
    }
    pmVar7 = std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                   *)this_00._M_current,(key_type *)in_stack_fffffffffffff088._M_current);
    std::set<int,_std::less<int>,_std::allocator<int>_>::erase
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff070,
               (key_type *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
    iVar2 = (local_20->jump).bb_true;
    LVar11 = *(LabelId *)((long)local_8f0 + 8);
    pVVar8 = std::optional<mir::inst::VarId>::value
                       ((optional<mir::inst::VarId> *)in_stack_fffffffffffff070);
    pJVar10 = (JumpInstruction *)local_c90;
    std::optional<mir::inst::VarId>::optional<mir::inst::VarId_&,_true>
              ((optional<mir::inst::VarId> *)pJVar10,
               (VarId *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
    mir::inst::JumpInstruction::JumpInstruction
              ((JumpInstruction *)this_00._M_current,(JumpInstructionKind)((ulong)pmVar7 >> 0x20),
               (int)pmVar7,(int)((ulong)pVVar8 >> 0x20),
               (optional<mir::inst::VarId> *)CONCAT44(LVar11,iVar2),
               (JumpKind)((ulong)pJVar10 >> 0x20));
    mir::inst::JumpInstruction::operator=
              (pJVar10,(JumpInstruction *)
                       CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
    mir::inst::JumpInstruction::~JumpInstruction((JumpInstruction *)(local_c90 + 0x18));
    std::
    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               *)pVVar8);
    Rewriter::~Rewriter((Rewriter *)0x1f0209);
    return;
  }
  __assert_fail("inst->inst_kind() == mir::inst::InstKind::Phi",
                "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
                ,0x180,
                "void optimization::loop_unrolling::expand_loop(mir::inst::MirFunction &, mir::inst::BasicBlk &, loop_info)"
               );
}

Assistant:

void expand_loop(mir::inst::MirFunction& func, mir::inst::BasicBlk& blk,
                 loop_info info) {
  auto& loop_start = func.basic_blks.at(info.loop_start);
  LOG(TRACE) << "unroll loop starts at  " << info.loop_start << std::endl;
  LOG(TRACE) << "init_val: " << info.init_var << std::endl;
  LOG(TRACE) << "change : "
             << mir::inst::OpInst(info.init_var, info.init_var,
                                  info.change.second, info.change.first)
             << std::endl;
  LOG(TRACE) << "continue when: "
             << mir::inst::OpInst(mir::inst::VarId(0), info.init_var,
                                  info.cmp.second, info.cmp.first)
             << std::endl;
  Rewriter rwt(func, blk, {info.phi_var, info.init_var}, info.change_var);
  info.rewrite_jump_cond(func.basic_blks.at(info.loop_start));

  auto end_iter = func.basic_blks.end();
  end_iter--;
  end_iter--;

  // extra loop
  auto extra_loop_start = end_iter->first + 1;
  auto extra_loop = end_iter->first + 2;
  func.basic_blks.insert(
      {extra_loop_start, mir::inst::BasicBlk(extra_loop_start)});
  func.basic_blks.insert({extra_loop, mir::inst::BasicBlk(extra_loop)});
  auto& extra_loop_start_blk = func.basic_blks.at(extra_loop_start);
  auto& extra_loop_blk = func.basic_blks.at(extra_loop);
  extra_loop_start_blk.preceding =
      std::set<mir::types::LabelId>{loop_start.id, blk.id};
  extra_loop_blk.preceding =
      std::set<mir::types::LabelId>{extra_loop_start_blk.id, extra_loop_blk.id};

  // original loop's end
  func.basic_blks.at(loop_start.jump.bb_false).preceding =
      std::set<mir::types::LabelId>{extra_loop_start_blk.id, extra_loop_blk.id};

  // copy original loop insts in extra loop blk
  for (auto& inst : blk.inst) {
    extra_loop_blk.inst.push_back(
        std::unique_ptr<mir::inst::Inst>(inst->deep_copy()));
  }
  extra_loop_blk.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, extra_loop_blk.id,
      loop_start.jump.bb_false, blk.jump.cond_or_ret,
      mir::inst::JumpKind::Loop);

  // after copy then can be rewrrote
  info.rewrite_jump_cond(blk);

  // init extra loop start 's insts
  int times = info.get_times();
  mir::inst::VarId new_change_var;
  auto insts = rwt.get_insts(times, new_change_var);
  auto new_phi = info.copy_var(info.init_var);
  extra_loop_start_blk.inst.push_back(std::make_unique<mir::inst::PhiInst>(
      new_phi, std::vector<mir::inst::VarId>{info.init_var, new_change_var}));
  auto cond = info.copy_var(blk.jump.cond_or_ret.value());
  extra_loop_start_blk.inst.push_back(std::make_unique<mir::inst::OpInst>(
      cond, new_phi, info.cmp.second, info.cmp.first));
  extra_loop_start_blk.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, extra_loop_blk.id,
      loop_start.jump.bb_false, cond, mir::inst::JumpKind::Loop);

  blk.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, blk.id, extra_loop_start_blk.id,
      blk.jump.cond_or_ret.value(), mir::inst::JumpKind::Loop);
  auto& inst = extra_loop_blk.inst.front();
  auto& i = *inst;
  assert(inst->inst_kind() == mir::inst::InstKind::Phi);
  auto phiInst = dynamic_cast<mir::inst::PhiInst*>(&i);
  phiInst->vars.erase(
      std::find(phiInst->vars.begin(), phiInst->vars.end(), info.init_var));
  phiInst->vars.push_back(new_phi);
  blk.inst.clear();
  for (auto& inst : insts) {
    blk.inst.push_back(std::move(inst));
  }
  func.basic_blks.at(loop_start.jump.bb_false)
      .preceding.erase(loop_start.jump.bb_true);

  loop_start.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, loop_start.jump.bb_true,
      extra_loop_start_blk.id, loop_start.jump.cond_or_ret.value());
  // auto& end_loop_blk = func.basic_blks.at(loop_start.jump.bb_true);
  // for (auto iter = end_loop_blk.inst.begin();
  //      iter != end_loop_blk.inst.end() &&
  //      iter->get()->inst_kind() == mir::inst::InstKind::Phi;
  //      iter++) {
  //   auto& inst = *iter;
  //   auto& i = *inst;
  //   auto phiInst = dynamic_cast<mir::inst::PhiInst*>(&i);
  //   if (phiInst->useVars().count(info.change_var)) {
  //     phiInst->vars.erase(std::find(phiInst->vars.begin(),
  //     phiInst->vars.end(),
  //                                   info.change_var));
  //   }
  //   if (times) {
  //     if (phiInst->useVars().count(info.init_var)) {
  //       phiInst->vars.erase(std::find(
  //           phiInst->vars.begin(), phiInst->vars.end(),
  //           info.init_var));
  //       phiInst->vars.push_back(new_change_var);
  //     }
  //   }
  // }
}